

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form3_Prewitt(PrewittForm3 Prewitt)

{
  bool bVar1;
  code *in_RDI;
  Image output;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image input;
  undefined1 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff49;
  undefined1 in_stack_ffffffffffffff4a;
  byte in_stack_ffffffffffffff4b;
  uint uVar2;
  uint8_t value;
  Image *reference;
  uint32_t in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff5c;
  Image *in_stack_ffffffffffffff60;
  uint local_7c;
  uint local_78;
  undefined4 local_74;
  undefined4 local_70;
  Image local_60;
  undefined1 local_38 [40];
  code *local_10;
  byte local_1;
  
  reference = &local_60;
  uVar2 = (uint)in_stack_ffffffffffffff4b;
  value = '\0';
  local_10 = in_RDI;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
             (uint8_t)((ulong)reference >> 0x38),(uint8_t)((ulong)reference >> 0x30));
  Test_Helper::uniformImage(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,reference);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e6933);
  Unit_Test::generateRoi
            (in_stack_ffffffffffffff60,
             (uint32_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (uint32_t *)reference,
             (uint32_t *)
             CONCAT17(value,CONCAT43(uVar2,CONCAT12(in_stack_ffffffffffffff4a,
                                                    CONCAT11(in_stack_ffffffffffffff49,
                                                             in_stack_ffffffffffffff48)))),
             (uint32_t *)0x1e6954);
  if ((local_78 < 3) || (local_7c < 3)) {
    local_1 = 1;
  }
  else {
    (*local_10)(&stack0xffffffffffffff58,local_38,local_70,local_74,local_78,local_7c);
    bVar1 = Unit_Test::equalSize
                      (reference,CONCAT13(value,(int3)(uVar2 >> 8)),
                       CONCAT13((char)uVar2,
                                CONCAT12(in_stack_ffffffffffffff4a,
                                         CONCAT11(in_stack_ffffffffffffff49,
                                                  in_stack_ffffffffffffff48))));
    local_1 = false;
    if (bVar1) {
      local_1 = Unit_Test::verifyImage(reference,value);
    }
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x1e6a38);
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e6a61);
  return (bool)(local_1 & 1);
}

Assistant:

bool form3_Prewitt(PrewittForm3 Prewitt)
    {
        const PenguinV_Image::Image input = uniformImage();

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );
        if ( (roiWidth < 3) || (roiHeight < 3) )
            return true;

        const PenguinV_Image::Image output = Prewitt( input, roiX, roiY, roiWidth, roiHeight );

        return equalSize( output, roiWidth, roiHeight ) && verifyImage( output, 0u );
    }